

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

word * Abc_TtSymFunGenerate(char *pOnes,int nVars)

{
  int iVar1;
  word *p;
  size_t sVar2;
  word *pTruth;
  int Count;
  int k;
  int m;
  int nVars_local;
  char *pOnes_local;
  
  iVar1 = Abc_TtWordNum(nVars);
  p = (word *)calloc((long)iVar1,8);
  sVar2 = strlen(pOnes);
  if ((int)sVar2 == nVars + 1) {
    for (Count = 0; Count < 1 << ((byte)nVars & 0x1f); Count = Count + 1) {
      pTruth._0_4_ = 0;
      for (pTruth._4_4_ = 0; pTruth._4_4_ < nVars; pTruth._4_4_ = pTruth._4_4_ + 1) {
        pTruth._0_4_ = (Count >> ((byte)pTruth._4_4_ & 0x1f) & 1U) + (int)pTruth;
      }
      if (pOnes[(int)pTruth] == '1') {
        Abc_TtXorBit(p,Count);
      }
    }
    return p;
  }
  __assert_fail("(int)strlen(pOnes) == nVars + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                ,0xdad,"word *Abc_TtSymFunGenerate(char *, int)");
}

Assistant:

static inline word * Abc_TtSymFunGenerate( char * pOnes, int nVars )
{
    int m, k, Count;
    word * pTruth = ABC_CALLOC( word, Abc_TtWordNum(nVars) );
    assert( (int)strlen(pOnes) == nVars + 1 );
    for ( m = 0; m < (1 << nVars); m++ )
    {
        Count = 0;
        for ( k = 0; k < nVars; k++ )
            Count += (m >> k) & 1;
        if ( pOnes[Count] == '1' )
            Abc_TtXorBit( pTruth, m );
    }
    return pTruth;
}